

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O2

void __thiscall re2c::Binary::~Binary(Binary *this)

{
  Cond *this_00;
  If *pIVar1;
  
  this_00 = this->cond;
  if (this_00 != (Cond *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00,0x28);
  pIVar1 = this->thn;
  if (pIVar1 != (If *)0x0) {
    If::~If(pIVar1);
  }
  operator_delete(pIVar1,0x10);
  pIVar1 = this->els;
  if (pIVar1 != (If *)0x0) {
    If::~If(pIVar1);
  }
  operator_delete(pIVar1,0x10);
  return;
}

Assistant:

Binary::~Binary ()
{
	delete cond;
	delete thn;
	delete els;
}